

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerTriangles.h
# Opt level: O0

void __thiscall
RayTracerTriangles::RayTracerTriangles(RayTracerTriangles *this,RayTracerConfig *config)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  float *pfVar8;
  KdNode *pKVar9;
  Point PVar10;
  undefined8 local_90;
  Point pMax;
  undefined8 local_70;
  Point pMin;
  Triangle *triangle;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Triangle,_std::allocator<Triangle>_> *__range1;
  vector<float,_std::allocator<float>_> ranges;
  RayTracerConfig *config_local;
  RayTracerTriangles *this_local;
  
  RayTracerBase::RayTracerBase(&this->super_RayTracerBase,config);
  iVar3 = std::thread::hardware_concurrency();
  this->threadNumber = iVar3;
  this->kdTree = (KdNode *)0x0;
  poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,this->threadNumber);
  std::operator<<(poVar4," threads available\n");
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&__range1);
  sVar5 = std::vector<Triangle,_std::allocator<Triangle>_>::size(&config->triangles);
  if (sVar5 != 0) {
    pvVar6 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](&config->triangles,0);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&__range1,(value_type_conflict *)pvVar6);
    pvVar6 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](&config->triangles,0);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&__range1,(value_type_conflict *)pvVar6);
    pvVar6 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](&config->triangles,0);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&__range1,&(pvVar6->x).y);
    pvVar6 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](&config->triangles,0);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&__range1,&(pvVar6->x).y);
    pvVar6 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](&config->triangles,0);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&__range1,&(pvVar6->x).z);
    pvVar6 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](&config->triangles,0);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&__range1,&(pvVar6->x).z);
  }
  __end1 = std::vector<Triangle,_std::allocator<Triangle>_>::begin(&config->triangles);
  triangle = (Triangle *)std::vector<Triangle,_std::allocator<Triangle>_>::end(&config->triangles);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Triangle_*,_std::vector<Triangle,_std::allocator<Triangle>_>_>
                                *)&triangle);
    if (!bVar2) break;
    register0x00000000 =
         __gnu_cxx::
         __normal_iterator<const_Triangle_*,_std::vector<Triangle,_std::allocator<Triangle>_>_>::
         operator*(&__end1);
    PVar10 = getMinPoint(register0x00000000);
    pMin.x = PVar10.z;
    unique0x100001b7 = PVar10._0_8_;
    local_70 = unique0x100001b7;
    PVar10 = getMaxPoint(stack0xffffffffffffffa0);
    pMax.x = PVar10.z;
    local_90 = PVar10._0_8_;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&__range1,0);
    pfVar8 = std::min<float>(pvVar7,(float *)&local_70);
    fVar1 = *pfVar8;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&__range1,0);
    *pvVar7 = fVar1;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&__range1,1);
    pfVar8 = std::max<float>(pvVar7,(float *)&local_90);
    fVar1 = *pfVar8;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&__range1,1);
    *pvVar7 = fVar1;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&__range1,2);
    pfVar8 = std::min<float>(pvVar7,(float *)((long)&local_70 + 4));
    fVar1 = *pfVar8;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&__range1,2);
    *pvVar7 = fVar1;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&__range1,3);
    pfVar8 = std::max<float>(pvVar7,(float *)((long)&local_90 + 4));
    fVar1 = *pfVar8;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&__range1,3);
    *pvVar7 = fVar1;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&__range1,4);
    pfVar8 = std::min<float>(pvVar7,&pMin.x);
    fVar1 = *pfVar8;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&__range1,4);
    *pvVar7 = fVar1;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&__range1,5);
    pfVar8 = std::max<float>(pvVar7,&pMax.x);
    fVar1 = *pfVar8;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&__range1,5);
    *pvVar7 = fVar1;
    __gnu_cxx::
    __normal_iterator<const_Triangle_*,_std::vector<Triangle,_std::allocator<Triangle>_>_>::
    operator++(&__end1);
  }
  pKVar9 = KdNode::build(&config->triangles,(vector<float,_std::allocator<float>_> *)&__range1,0);
  this->kdTree = pKVar9;
  poVar4 = std::operator<<((ostream *)&std::cerr,"building complete");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&__range1);
  return;
}

Assistant:

RayTracerTriangles(RayTracerConfig const& config)
    : RayTracerBase(config)
    , threadNumber(std::thread::hardware_concurrency())
  {
    std::cerr << threadNumber << " threads available\n";
    std::vector<float> ranges;
    if(config.triangles.size() > 0)
    {
      ranges.push_back(config.triangles[0].x.x);
      ranges.push_back(config.triangles[0].x.x);
      ranges.push_back(config.triangles[0].x.y);
      ranges.push_back(config.triangles[0].x.y);
      ranges.push_back(config.triangles[0].x.z);
      ranges.push_back(config.triangles[0].x.z);
    }
    for(auto const& triangle : config.triangles)
    {
      Point pMin = getMinPoint(triangle);
      Point pMax = getMaxPoint(triangle);

       ranges[0] = std::min(ranges[0], pMin.x); 
       ranges[1] = std::max(ranges[1], pMax.x); 
       ranges[2] = std::min(ranges[2], pMin.y); 
       ranges[3] = std::max(ranges[3], pMax.y); 
       ranges[4] = std::min(ranges[4], pMin.z); 
       ranges[5] = std::max(ranges[5], pMax.z); 
    }
    kdTree = KdNode::build(const_cast<RayTracerConfig&>(config).triangles, ranges, 0);
    std::cerr << "building complete" << std::endl;
  }